

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

expression_ptr __thiscall mjs::parser::parse_member_expression(parser *this)

{
  _Head_base<2UL,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_false>
  _Var1;
  undefined8 uVar2;
  undefined4 uVar3;
  int iVar4;
  char *in_RCX;
  pointer *__ptr;
  parser *in_RSI;
  _Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_> _Var5;
  wstring_view id_00;
  source_extend id_extend;
  wstring id;
  token id_token;
  _Head_base<2UL,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>,_false>
  local_e8;
  undefined1 local_e0 [24];
  undefined1 local_c8 [32];
  undefined1 local_a8 [56];
  undefined1 local_70 [64];
  
  local_e8._M_head_impl._M_t.
  super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
  super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
  super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
       (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)
       (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)0x0;
  iVar4 = (int)in_RSI;
  accept((parser *)local_a8,iVar4,(sockaddr *)0x59,(socklen_t *)in_RCX);
  uVar3 = local_a8._0_4_;
  token::destroy((token *)local_a8);
  if (uVar3 == eof) {
    if (0 < (int)in_RSI->version_) {
      accept((parser *)local_a8,iVar4,(sockaddr *)0x4d,(socklen_t *)in_RCX);
      uVar3 = local_a8._0_4_;
      token::destroy((token *)local_a8);
      if (uVar3 != eof) {
        local_c8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_c8._16_4_ = es1;
        local_e0._0_8_ =
             (in_RSI->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
        local_e0._8_8_ =
             (in_RSI->source_).super___shared_ptr<mjs::source_file,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          in_RCX = &__libc_single_threaded;
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_)->_M_use_count + 1;
          }
        }
        local_e0._16_4_ = in_RSI->token_start_;
        local_e0._20_4_ = (undefined4)(in_RSI->lexer_).text_pos_;
        local_c8._0_8_ = (element_type *)(local_c8 + 0x10);
        accept((parser *)local_a8,iVar4,(sockaddr *)0x2,(socklen_t *)in_RCX);
        if ((local_a8._0_4_ == identifier) || (local_a8._0_4_ == string_literal)) {
          std::__cxx11::wstring::_M_assign((wstring *)local_c8);
        }
        else if (local_a8._0_4_ != eof) {
          __assert_fail("has_text()",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.h"
                        ,0xd6,"const std::wstring &mjs::token::text() const");
        }
        token::destroy((token *)local_a8);
        parse_function_abi_cxx11_
                  ((tuple<mjs::source_extend,_std::vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>,_std::unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>_>
                    *)local_a8,in_RSI);
        iVar4 = (**(code **)(*(long *)local_a8._0_8_ + 0x18))();
        if (iVar4 == 0) {
          if (*(char *)(local_a8._0_8_ + 0x38) == '\x01') {
            id_00._M_str = (wchar_t *)local_c8._0_8_;
            id_00._M_len = local_c8._8_8_;
            check_function_name(in_RSI,id_00,(source_extend *)local_e0);
          }
          make_expression<mjs::function_expression,mjs::source_extend&,std::__cxx11::wstring&,std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>,std::unique_ptr<mjs::statement,std::default_delete<mjs::statement>>>
                    (this,(source_extend *)in_RSI,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     (local_a8 + 0x20),
                     (vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      *)local_c8,
                     (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)
                     (local_a8 + 8));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._40_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_a8._40_8_);
          }
          std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)(local_a8 + 8));
          if ((unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)local_a8._0_8_ !=
              (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)0x0) {
            (**(code **)(*(long *)local_a8._0_8_ + 8))();
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e0._8_8_);
          }
          if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
            operator_delete((void *)local_c8._0_8_,CONCAT44(local_c8._20_4_,local_c8._16_4_) * 4 + 4
                           );
          }
          if (local_e8._M_head_impl._M_t.
              super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
              super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
              super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl ==
              (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)0x0)
          {
            return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                    )(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                      )this;
          }
          (**(code **)(*(long *)local_e8._M_head_impl._M_t.
                                super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 8))()
          ;
          return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                 )(__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>
                   )this;
        }
        __assert_fail("block->type() == statement_type::block",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/parser.cpp"
                      ,0x2c3,"expression_ptr mjs::parser::parse_member_expression()");
      }
    }
    parse_primary_expression((parser *)local_a8);
    uVar2 = local_a8._0_8_;
    _Var1._M_head_impl._M_t.
    super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
    super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
    super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         local_e8._M_head_impl._M_t.
         super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
         super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_a8._0_8_ = (__uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>)0x0;
    local_e8._M_head_impl._M_t.
    super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
    super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
    super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)
         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)uVar2;
    if (_Var1._M_head_impl._M_t.
        super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
        super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
        super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl ==
        (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)0x0)
    goto LAB_0017c26e;
    (**(code **)(*(long *)_Var1._M_head_impl._M_t.
                          super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                          .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 8))();
    _Var5.super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         (_Head_base<0UL,_mjs::statement_*,_false>)
         (_Head_base<0UL,_mjs::statement_*,_false>)local_a8._0_8_;
  }
  else {
    parse_member_expression((parser *)local_c8);
    if ((in_RSI->current_token_).type_ == lparen) {
      parse_argument_list((expression_list *)local_a8,in_RSI);
      make_expression<mjs::call_expression,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::vector<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::allocator<std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>>>
                ((parser *)local_e0,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)in_RSI,
                 (vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                  *)local_c8);
      uVar2 = local_c8._0_8_;
      local_c8._0_8_ = local_e0._0_8_;
      local_e0._0_8_ = (__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)0x0;
      if (((element_type *)uVar2 != (element_type *)0x0) &&
         ((**(code **)(*(long *)uVar2 + 8))(),
         (_Head_base<0UL,_mjs::expression_*,_false>)local_e0._0_8_ !=
         (_Head_base<0UL,_mjs::expression_*,_false>)0x0)) {
        (*((syntax_node *)local_e0._0_8_)->_vptr_syntax_node[1])();
      }
      local_e0._0_8_ = (__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)0x0;
      std::
      vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
      ::~vector((vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                 *)local_a8);
    }
    local_e0._0_4_ = 0x59;
    in_RCX = local_c8;
    make_expression<mjs::prefix_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_a8,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_e0);
    uVar2 = local_a8._0_8_;
    _Var1._M_head_impl._M_t.
    super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
    super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
    super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         local_e8._M_head_impl._M_t.
         super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
         super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_a8._0_8_ = (element_type *)0x0;
    local_e8._M_head_impl._M_t.
    super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
    super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
    super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)
         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)uVar2;
    _Var5.super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         (_Head_base<0UL,_mjs::statement_*,_false>)
         (_Head_base<0UL,_mjs::statement_*,_false>)local_c8._0_8_;
    if ((_Var1._M_head_impl._M_t.
         super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
         super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl !=
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)0x0) &&
       ((**(code **)(*(long *)_Var1._M_head_impl._M_t.
                              super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                              .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 8))(),
       _Var5.super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
            (_Head_base<0UL,_mjs::statement_*,_false>)
            (_Head_base<0UL,_mjs::statement_*,_false>)local_c8._0_8_,
       (statement *)local_a8._0_8_ != (statement *)0x0)) {
      (**(code **)(*(long *)local_a8._0_8_ + 8))();
      _Var5.super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
           (_Head_base<0UL,_mjs::statement_*,_false>)
           (_Head_base<0UL,_mjs::statement_*,_false>)local_c8._0_8_;
    }
  }
  if (_Var5.super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl != (statement *)0x0) {
    (**(code **)(*(long *)_Var5.super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 8))();
  }
LAB_0017c26e:
  local_70._16_8_ = this;
  while( true ) {
    while( true ) {
      accept((parser *)local_a8,iVar4,(sockaddr *)0x32,(socklen_t *)in_RCX);
      uVar3 = local_a8._0_4_;
      token::destroy((token *)local_a8);
      if (uVar3 == eof) break;
      parse_expression((parser *)local_a8);
      expect((token *)(local_70 + 0x18),in_RSI,rbracket,"parse_member_expression",0x2ce);
      token::destroy((token *)(local_70 + 0x18));
      local_e0._0_4_ = 0x32;
      in_RCX = (char *)&local_e8;
      make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
                ((parser *)local_c8,(token_type *)in_RSI,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)local_e0,
                 (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&local_e8);
      uVar2 = local_c8._0_8_;
      _Var1._M_head_impl._M_t.
      super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
      super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
           local_e8._M_head_impl._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
      local_c8._0_8_ = (element_type *)0x0;
      local_e8._M_head_impl._M_t.
      super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
      super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
      super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
           (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)
           (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)uVar2;
      if ((_Var1._M_head_impl._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl !=
           (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)0x0) &&
         ((**(code **)(*(long *)_Var1._M_head_impl._M_t.
                                super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                                .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 8))()
         , (element_type *)local_c8._0_8_ != (element_type *)0x0)) {
        (**(code **)(*(long *)local_c8._0_8_ + 8))();
      }
      if ((__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)
          local_a8._0_8_ != (tuple<mjs::statement_*,_std::default_delete<mjs::statement>_>)0x0) {
        (**(code **)(*(long *)local_a8._0_8_ + 8))();
      }
    }
    accept((parser *)local_a8,iVar4,(sockaddr *)0x25,(socklen_t *)in_RCX);
    uVar3 = local_a8._0_4_;
    token::destroy((token *)local_a8);
    if (uVar3 == eof) break;
    local_70._12_4_ = 0x25;
    get_identifier_name_abi_cxx11_((wstring *)local_c8,in_RSI,"parse_member_expression",0x2d1);
    token::token((token *)local_a8,string_literal,(wstring *)local_c8);
    make_expression<mjs::literal_expression,mjs::token>((parser *)local_70,(token *)in_RSI);
    in_RCX = (char *)&local_e8;
    make_expression<mjs::binary_expression,mjs::token_type,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>,std::unique_ptr<mjs::expression,std::default_delete<mjs::expression>>>
              ((parser *)local_e0,(token_type *)in_RSI,
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)
               (local_70 + 0xc),
               (unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_> *)&local_e8);
    uVar2 = local_e0._0_8_;
    _Var1._M_head_impl._M_t.
    super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
    super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
    super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         local_e8._M_head_impl._M_t.
         super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
         super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
    local_e0._0_8_ = (__uniq_ptr_impl<mjs::expression,_std::default_delete<mjs::expression>_>)0x0;
    local_e8._M_head_impl._M_t.
    super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
    super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
    super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl =
         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)
         (unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_>)uVar2;
    if ((_Var1._M_head_impl._M_t.
         super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
         super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
         super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl !=
         (__uniq_ptr_data<mjs::statement,_std::default_delete<mjs::statement>,_true,_true>)0x0) &&
       ((**(code **)(*(long *)_Var1._M_head_impl._M_t.
                              super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>
                              .super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl + 8))(),
       (_Head_base<0UL,_mjs::expression_*,_false>)local_e0._0_8_ !=
       (_Head_base<0UL,_mjs::expression_*,_false>)0x0)) {
      (*((syntax_node *)local_e0._0_8_)->_vptr_syntax_node[1])();
    }
    local_e0._0_8_ = (element_type *)0x0;
    if ((long *)local_70._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_70._0_8_ + 8))();
    }
    local_70._0_8_ = (long *)0x0;
    token::destroy((token *)local_a8);
    if ((element_type *)local_c8._0_8_ != (element_type *)(local_c8 + 0x10)) {
      operator_delete((void *)local_c8._0_8_,CONCAT44(local_c8._20_4_,local_c8._16_4_) * 4 + 4);
    }
  }
  *(unique_ptr<mjs::statement,_std::default_delete<mjs::statement>_> *)local_70._16_8_ =
       local_e8._M_head_impl._M_t.
       super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
       super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
       super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  return (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         (__uniq_ptr_data<mjs::expression,_std::default_delete<mjs::expression>,_true,_true>)
         local_70._16_8_;
}

Assistant:

expression_ptr parse_member_expression() {
        // MemberExpression :
        //  PrimaryExpression
        //  FunctionExpression
        //  MemberExpression [ Expression ]
        //  MemberExpression . Identifier (IdentifierName in ES5+)
        //  new MemberExpression Arguments

        expression_ptr me{};
        if (accept(token_type::new_)) {
            auto e = parse_member_expression();
            if (current_token_type() == token_type::lparen) {
                e = make_expression<call_expression>(std::move(e), parse_argument_list());
            }
            me = make_expression<prefix_expression>(token_type::new_, std::move(e));
        } else if (version_ >= version::es3 && accept(token_type::function_)) {
            std::wstring id{};
            const auto id_extend = current_extend();
            if (auto id_token = accept(token_type::identifier)) {
                id = id_token.text();
            }
            auto [extend, params, block] = parse_function();
            assert(block->type() == statement_type::block);
            if (static_cast<const block_statement&>(*block).strict_mode()) {
                check_function_name(id, id_extend);
            }
            return make_expression<function_expression>(extend, id, std::move(params), std::move(block));
        } else {
            me = parse_primary_expression();
        }
        for (;;) {
            if (accept(token_type::lbracket)) {
                auto e = parse_expression();
                EXPECT(token_type::rbracket);
                me = make_expression<binary_expression>(token_type::lbracket, std::move(me), std::move(e));
            } else if (accept(token_type::dot)) {
                me = make_expression<binary_expression>(token_type::dot, std::move(me), make_expression<literal_expression>(token{token_type::string_literal, get_identifier_name(__func__, __LINE__)}));
            } else {
                return me;
            }
        }
    }